

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsMouseHoveringRect(ImVec2 *r_min,ImVec2 *r_max,bool clip)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  undefined3 in_register_00000011;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ImRect rect_clipped;
  ImRect rect_for_touch;
  ImRect local_30;
  ImRect local_20;
  
  pIVar2 = GImGui;
  local_30.Min = *r_min;
  local_30.Max = *r_max;
  if (CONCAT31(in_register_00000011,clip) != 0) {
    ImRect::ClipWith(&local_30,&GImGui->CurrentWindow->ClipRect);
  }
  IVar1 = (pIVar2->Style).TouchExtraPadding;
  auVar6._8_8_ = 0;
  auVar6._0_4_ = IVar1.x;
  auVar6._4_4_ = IVar1.y;
  auVar4._8_8_ = 0;
  auVar4._0_4_ = local_30.Min.x;
  auVar4._4_4_ = local_30.Min.y;
  auVar4 = vsubps_avx(auVar4,auVar6);
  auVar5._0_4_ = IVar1.x + local_30.Max.x;
  auVar5._4_4_ = IVar1.y + local_30.Max.y;
  auVar5._8_8_ = 0;
  local_20 = (ImRect)vmovlhps_avx(auVar4,auVar5);
  bVar3 = ImRect::Contains(&local_20,&(pIVar2->IO).MousePos);
  return bVar3;
}

Assistant:

bool ImGui::IsMouseHoveringRect(const ImVec2& r_min, const ImVec2& r_max, bool clip)
{
    ImGuiContext& g = *GImGui;

    // Clip
    ImRect rect_clipped(r_min, r_max);
    if (clip)
        rect_clipped.ClipWith(g.CurrentWindow->ClipRect);

    // Expand for touch input
    const ImRect rect_for_touch(rect_clipped.Min - g.Style.TouchExtraPadding, rect_clipped.Max + g.Style.TouchExtraPadding);
    if (!rect_for_touch.Contains(g.IO.MousePos))
        return false;
    return true;
}